

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O3

void __thiscall leveldb::Benchmark::Open(Benchmark *this)

{
  char *pcVar1;
  Env *pEVar2;
  size_t sVar3;
  Benchmark *this_00;
  Status s;
  Options options;
  undefined1 auStack_168 [24];
  undefined1 *puStack_150;
  undefined1 auStack_140 [16];
  char acStack_130 [104];
  DB **ppDStack_c8;
  allocator local_a1;
  undefined1 local_a0 [24];
  FilterPolicy local_88 [2];
  Options local_78;
  
  if (this->db_ != (DB *)0x0) {
    __assert_fail("db_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/benchmarks/db_bench.cc"
                  ,0x2b1,"void leveldb::Benchmark::Open()");
  }
  Options::Options(&local_78);
  local_78.env = (anonymous_namespace)::g_env;
  local_78.create_if_missing = (bool)(FLAGS_use_existing_db ^ 1);
  local_78.block_cache = this->cache_;
  local_78.write_buffer_size = (size_t)FLAGS_write_buffer_size;
  local_78.max_file_size = (size_t)FLAGS_max_file_size;
  local_78.block_size = (size_t)FLAGS_block_size;
  local_78.max_open_files = FLAGS_open_files;
  local_78.filter_policy = this->filter_policy_;
  local_78.reuse_logs = FLAGS_reuse_logs;
  std::__cxx11::string::string((string *)(local_a0 + 8),FLAGS_db,&local_a1);
  DB::Open((DB *)local_a0,&local_78,(string *)(local_a0 + 8),&this->db_);
  if ((FilterPolicy *)local_a0._8_8_ != local_88) {
    operator_delete((void *)local_a0._8_8_);
  }
  if ((_func_int **)local_a0._0_8_ == (_func_int **)0x0) {
    return;
  }
  this_00 = (Benchmark *)local_a0;
  Open(this_00);
  pcVar1 = FLAGS_db;
  ppDStack_c8 = &this->db_;
  this_00->heap_counter_ = this_00->heap_counter_ + 1;
  snprintf(acStack_130,100,"%s/heap-%04d",pcVar1);
  pEVar2 = (anonymous_namespace)::g_env;
  puStack_150 = auStack_140;
  sVar3 = strlen(acStack_130);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&puStack_150,acStack_130,acStack_130 + sVar3);
  (*pEVar2->_vptr_Env[4])(auStack_168,pEVar2,(string *)&puStack_150,auStack_168 + 8);
  if (puStack_150 != auStack_140) {
    operator_delete(puStack_150);
  }
  if ((Cache *)auStack_168._0_8_ == (Cache *)0x0) {
    HeapProfile();
  }
  else {
    HeapProfile((Benchmark *)auStack_168);
  }
  if ((Cache *)auStack_168._0_8_ != (Cache *)0x0) {
    operator_delete__((void *)auStack_168._0_8_);
  }
  return;
}

Assistant:

void Open() {
    assert(db_ == nullptr);
    Options options;
    options.env = g_env;
    options.create_if_missing = !FLAGS_use_existing_db;
    options.block_cache = cache_;
    options.write_buffer_size = FLAGS_write_buffer_size;
    options.max_file_size = FLAGS_max_file_size;
    options.block_size = FLAGS_block_size;
    options.max_open_files = FLAGS_open_files;
    options.filter_policy = filter_policy_;
    options.reuse_logs = FLAGS_reuse_logs;
    Status s = DB::Open(options, FLAGS_db, &db_);
    if (!s.ok()) {
      std::fprintf(stderr, "open error: %s\n", s.ToString().c_str());
      std::exit(1);
    }
  }